

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guess_basis.cc
# Opt level: O2

vector<int,_std::allocator<int>_> *
ipx::GuessBasis(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Control *control,
               Model *model,double *colweights)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  pointer pdVar6;
  pointer piVar7;
  int *__first;
  Int *Ai;
  double *values;
  pointer marked_00;
  pointer piVar8;
  pointer Ap;
  pointer Ai_00;
  bool bVar9;
  Int t;
  Int top;
  long lVar10;
  ulong uVar11;
  ostream *poVar12;
  long lVar13;
  pointer piVar14;
  int iVar15;
  int iVar16;
  size_type __n;
  pointer piVar17;
  pointer piVar18;
  long lVar19;
  ulong uVar20;
  size_type sVar21;
  uint uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  int local_1f4;
  string local_1e0;
  Control *local_1c0;
  double *local_1b8;
  Vector lhs;
  vector<int,_std::allocator<int>_> work;
  vector<int,_std::allocator<int>_> pattern;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> rownumber;
  SparseMatrix L;
  vector<int,_std::allocator<int>_> active;
  vector<int,_std::allocator<int>_> work3;
  vector<int,_std::allocator<int>_> work2;
  vector<int,_std::allocator<int>_> work_1;
  
  uVar1 = model->num_rows_;
  iVar2 = model->num_cols_;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  L.nrow_ = -1;
  local_1c0 = control;
  std::vector<int,_std::allocator<int>_>::vector
            (&rownumber,(long)(int)uVar1,&L.nrow_,(allocator_type *)&local_1e0);
  L.nrow_ = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&active,(long)(int)(iVar2 + uVar1),&L.nrow_,(allocator_type *)&local_1e0);
  piVar18 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar8 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar15 = model->num_rows_;
  sVar21 = (size_type)iVar15;
  iVar16 = model->num_cols_;
  std::vector<int,_std::allocator<int>_>::vector(&pattern,sVar21,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work,sVar21,(allocator_type *)&L);
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked,sVar21,&L.nrow_,(allocator_type *)&local_1e0);
  std::valarray<double>::valarray(&lhs,sVar21);
  SparseMatrix::SparseMatrix(&L,iVar15,0);
  local_1f4 = 0;
  uVar22 = 0;
  local_1b8 = colweights;
  while (Ai_00 = L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        Ap = L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
        marked_00 = marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
        piVar7 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        piVar14 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start, local_1e0._M_dataplus._M_p._0_4_ = uVar22,
        (int)uVar22 < iVar16 + iVar15) {
    if (INFINITY <= local_1b8[(int)uVar22]) {
      piVar17 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      top = L.nrow_;
      for (lVar19 = (long)piVar17[(int)uVar22]; lVar19 < piVar17[(long)(int)uVar22 + 1];
          lVar19 = lVar19 + 1) {
        iVar3 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar19];
        if (marked_00[iVar3] != uVar22) {
          top = DepthFirstSearch(iVar3,Ap,Ai_00,piVar8,top,piVar7,marked_00,uVar22,piVar14);
          piVar17 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      lVar13 = (long)(int)(uint)local_1e0._M_dataplus._M_p;
      lVar10 = (long)top;
      for (lVar19 = lVar10; lVar19 < L.nrow_; lVar19 = lVar19 + 1) {
        lhs._M_data
        [pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar19]] = 0.0;
      }
      iVar3 = piVar17[lVar13 + 1];
      piVar14 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 = (model->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar19 = (long)piVar17[lVar13]; lVar19 < iVar3; lVar19 = lVar19 + 1) {
        lhs._M_data[piVar14[lVar19]] = pdVar6[lVar19];
      }
      dVar23 = 0.0;
      uVar22 = 0xffffffff;
      for (; lVar10 < L.nrow_; lVar10 = lVar10 + 1) {
        uVar4 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        dVar24 = lhs._M_data[(int)uVar4];
        if ((dVar24 != 0.0) || (NAN(dVar24))) {
          uVar5 = piVar8[(int)uVar4];
          if ((int)uVar5 < 0) {
            if (dVar23 < ABS(dVar24)) {
              dVar23 = ABS(dVar24);
              uVar22 = uVar4;
            }
          }
          else {
            iVar3 = L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(ulong)uVar5 + 1];
            for (lVar19 = (long)L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar5]; lVar19 < iVar3;
                lVar19 = lVar19 + 1) {
              lhs._M_data
              [L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar19]] =
                   lhs._M_data
                   [L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar19]] -
                   L.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar19] * dVar24;
            }
          }
        }
      }
      if ((int)uVar22 < 0) {
        dVar23 = 0.0;
      }
      else {
        dVar23 = lhs._M_data[uVar22];
      }
      if (0.001 < ABS(dVar23)) {
        piVar8[(int)uVar22] =
             (int)((ulong)((long)(__return_storage_ptr__->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict2 *)&local_1e0);
        uVar11 = (ulong)(int)(uint)local_1e0._M_dataplus._M_p;
        piVar14 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (lVar19 = (long)piVar14[uVar11]; lVar19 < piVar14[(long)(int)uVar11 + 1];
            lVar19 = lVar19 + 1) {
          iVar3 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar19];
          if (piVar8[iVar3] < 0) {
            dVar24 = lhs._M_data[iVar3];
            if ((dVar24 != 0.0) || (NAN(dVar24))) {
              SparseMatrix::push_back(&L,iVar3,dVar24 / dVar23);
              uVar11 = (ulong)(uint)local_1e0._M_dataplus._M_p;
              piVar14 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
          }
        }
        SparseMatrix::add_column(&L);
        local_1f4 = local_1f4 + 1;
        lVar13 = (long)(int)(uint)local_1e0._M_dataplus._M_p;
      }
      piVar18[lVar13] = 0;
    }
    uVar22 = (uint)local_1e0._M_dataplus._M_p + 1;
  }
  poVar12 = Control::Debug(local_1c0,1);
  Textline<char[44]>(&local_1e0,(char (*) [44])"Number of free variables in starting basis:");
  values = local_1b8;
  poVar12 = std::operator<<(poVar12,(string *)&local_1e0);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_1f4);
  std::operator<<(poVar12,'\n');
  std::__cxx11::string::~string((string *)&local_1e0);
  SparseMatrix::~SparseMatrix(&L);
  operator_delete(lhs._M_data);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&marked.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&pattern.super__Vector_base<int,_std::allocator<int>_>);
  piVar18 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar8 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar20 = 0;
  uVar11 = (ulong)(uint)model->num_rows_;
  if (model->num_rows_ < 1) {
    uVar11 = uVar20;
  }
  iVar15 = 0;
  for (; uVar20 != uVar11; uVar20 = uVar20 + 1) {
    if (piVar8[uVar20] < 0) {
      L.nrow_ = -1;
      piVar14 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar7 = (model->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar24 = 0.0;
      dVar23 = 0.0;
      for (lVar19 = (long)piVar7[uVar20]; lVar19 < piVar7[uVar20 + 1]; lVar19 = lVar19 + 1) {
        iVar16 = (model->AIt_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar19];
        if (piVar18[iVar16] != 0) {
          dVar25 = ABS((model->AIt_).values_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar19]) * values[iVar16];
          dVar26 = dVar25;
          if (dVar25 <= dVar24) {
            dVar26 = dVar24;
          }
          dVar24 = dVar26;
          if ((dVar23 < dVar25) && (piVar14[(long)iVar16 + 1] == piVar14[iVar16] + 1)) {
            dVar23 = dVar25;
            L.nrow_ = iVar16;
          }
        }
      }
      if ((0.0 < dVar23) && (dVar24 * 0.5 <= dVar23)) {
        piVar8[uVar20] =
             (int)((ulong)((long)(__return_storage_ptr__->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(__return_storage_ptr__->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&L.nrow_);
        piVar18[L.nrow_] = 0;
        iVar15 = iVar15 + 1;
      }
    }
  }
  poVar12 = Control::Debug(local_1c0,1);
  Textline<char[40]>((string *)&L,(char (*) [40])"Number of singletons in starting basis:");
  poVar12 = std::operator<<(poVar12,(string *)&L);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar15);
  std::operator<<(poVar12,'\n');
  std::__cxx11::string::~string((string *)&L);
  piVar8 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar22 = model->num_rows_;
  __n = (size_type)(int)uVar22;
  iVar15 = model->num_cols_;
  sVar21 = (long)iVar15 + __n;
  Sortperm(&pattern,(Int)sVar21,values,true);
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector(&work,__n,&L.nrow_,(allocator_type *)&local_1e0);
  uVar11 = 0;
  uVar20 = 0;
  if (0 < (int)uVar22) {
    uVar20 = (ulong)uVar22;
  }
  for (; uVar20 != uVar11; uVar11 = uVar11 + 1) {
    if (-1 < piVar8[uVar11]) {
      work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar11] = -2;
    }
  }
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked,sVar21,&L.nrow_,(allocator_type *)&local_1e0);
  __first = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  Ai = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&lhs,__first,__first + (long)iVar15 + __n,
             (allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work_1,__n,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work2,__n + 1,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work3,__n + 1,(allocator_type *)&L);
  iVar15 = 0;
  iVar16 = 0;
  for (piVar18 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      piVar18 !=
      pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish; piVar18 = piVar18 + 1) {
    L.nrow_ = *piVar18;
    if (active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[L.nrow_] != 0) {
      if ((local_1b8[L.nrow_] == 0.0) && (!NAN(local_1b8[L.nrow_]))) break;
      bVar9 = AugmentingPath(L.nrow_,__first,Ai,
                             work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,(Int *)lhs._M_size,
                             marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             work2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             work3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      if (bVar9) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&L.nrow_);
        iVar15 = iVar15 + 1;
      }
      else {
        iVar16 = iVar16 + 1;
      }
      if ((int)((uVar22 - (int)((ulong)((long)(__return_storage_ptr__->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish -
                                       (long)(__return_storage_ptr__->
                                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                             super__Vector_impl_data._M_start) >> 2)) * 10) <=
          iVar16) break;
    }
  }
  for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
    if (-1 < work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar11]) {
      piVar8[uVar11] = uVar22;
    }
  }
  poVar12 = Control::Debug(local_1c0,1);
  Textline<char[33]>((string *)&L,(char (*) [33])"Number of other columns matched:");
  poVar12 = std::operator<<(poVar12,(string *)&L);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar15);
  poVar12 = std::operator<<(poVar12,'\n');
  Textline<char[32]>(&local_1e0,(char (*) [32])"Number of other columns failed:");
  poVar12 = std::operator<<(poVar12,(string *)&local_1e0);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar16);
  std::operator<<(poVar12,'\n');
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&L);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work3.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work2.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work_1.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&lhs);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&marked.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&pattern.super__Vector_base<int,_std::allocator<int>_>);
  uVar20 = 0;
  uVar11 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar11 = uVar20;
  }
  for (; uVar11 != uVar20; uVar20 = uVar20 + 1) {
    if (rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar20] < 0) {
      L.nrow_ = (int)uVar20 + iVar2;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&L.nrow_);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&active.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&rownumber.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Int> GuessBasis(const Control& control, const Model& model,
                            const double* colweights) {
    const Int m = model.rows();
    const Int n = model.cols();

    // basis starts empty and is filled one index at a time. rownumber[i] >= 0
    // iff row i was pivot row when a column was added to the basis. (The
    // specific value has a different meaning in each method.) A column is
    // "active" if it is eligible for being added to the basis.
    std::vector<Int> basis, rownumber(m, -1);
    std::vector<int> active(n+m, 1);

    ProcessFreeColumns(control, model, colweights, &basis, rownumber.data(),
                       active.data());
    ProcessSingletons(control, model, colweights, &basis, rownumber.data(),
                      active.data());
    ProcessRemaining(control, model, colweights, &basis, rownumber.data(),
                     active.data());

    // Complete basis with unit columns.
    for (Int i = 0; i < m; i++) {
        if (rownumber[i] < 0)
            basis.push_back(n+i);
    }
    assert((Int)basis.size() == m);
    return basis;
}